

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O3

void generateDatasetImages
               (string *plate_path,string *backgr_path,string *output_folder,int image_size,
               double plate_scale,int nwarps)

{
  long *plVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  result_type rVar5;
  result_type rVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  long lVar9;
  ulong uVar10;
  Mat *pMVar11;
  undefined8 uVar12;
  _List_node_base *p_Var13;
  uint __len;
  uint uVar14;
  double dVar15;
  double dVar16;
  string name;
  uniform_int_distribution<int> intgen;
  list<cv::Mat,_std::allocator<cv::Mat>_> wrps;
  Mat back;
  Mat resplt;
  Mat resbg;
  ofstream file;
  Mat blured;
  Mat plate;
  mt19937 gen;
  random_device rd;
  Point local_2cb8;
  string *local_2cb0;
  long local_2ca8 [2];
  long *local_2c98;
  long local_2c90;
  long local_2c88;
  undefined8 uStack_2c80;
  _InputArray local_2c78;
  double local_2c60;
  int local_2c58;
  int local_2c54;
  uniform_int_distribution<int> local_2c50;
  double local_2c48;
  undefined1 local_2c38 [16];
  long local_2c28;
  long *local_2c18 [2];
  long local_2c08 [2];
  double local_2bf8;
  undefined8 uStack_2bf0;
  double local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8;
  string **local_2bd0;
  string *local_2bc8;
  string *local_2bc0;
  _List_node_base *local_2bb8;
  double local_2bb0;
  undefined8 local_2ba8;
  _List_base<cv::Mat,_std::allocator<cv::Mat>_> local_2ba0;
  string local_2b88 [3];
  long *local_2b28 [2];
  long local_2b18 [10];
  uint local_2ac8;
  uint local_2ac4;
  Mat local_2ac0 [96];
  string **local_2a60;
  string *local_2a58;
  string *local_2a50 [29];
  ios_base local_2968 [264];
  Mat local_2860 [96];
  Mat local_2800 [96];
  string local_27a0 [8];
  int local_2798;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  local_2c60 = plate_scale;
  local_2bc8 = backgr_path;
  local_2bc0 = output_folder;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_13b8,output_folder,auto_format);
  std::filesystem::create_directory((path *)&local_13b8);
  std::filesystem::__cxx11::path::~path((path *)&local_13b8);
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar9 = 1;
  uVar10 = local_2740._M_x[0];
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar9);
    local_2740._M_x[lVar9] = uVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_2740._M_p = 0x270;
  dVar16 = (double)image_size;
  local_2c50._M_param._M_b = (int)(dVar16 - local_2c60 * dVar16);
  local_2c50._M_param._M_a = 1;
  cv::imread(local_27a0,(int)plate_path);
  cv::Mat::Mat(local_2800);
  local_2ac8 = local_2798 / 2 | 1;
  local_2a50[0] = (string *)0x0;
  local_2a60 = (string **)CONCAT44(local_2a60._4_4_,0x1010000);
  local_2b88[0].field_2._M_allocated_capacity = (Mat *)0x0;
  local_2b88[0]._M_dataplus._M_p._0_4_ = 0x2010000;
  local_2b88[0]._M_string_length = (size_type)local_2800;
  local_2ac4 = local_2ac8;
  local_2a58 = local_27a0;
  cv::GaussianBlur(0x4010000000000000,0,&local_2a60,local_2b88,&local_2ac8,4);
  cv::Mat::Mat(local_2860,local_2800);
  randomWarps_abi_cxx11_((list<cv::Mat,_std::allocator<cv::Mat>_> *)&local_2ba0,local_2860,nwarps);
  cv::Mat::~Mat(local_2860);
  if (local_2ba0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_2ba0) {
    local_2bd0 = _VTT;
    local_2bd8 = _flush;
    p_Var13 = local_2ba0._M_impl._M_node.super__List_node_base._M_next;
    do {
      generateDatasetImages::imagenum = generateDatasetImages::imagenum + 1;
      local_2a60 = local_2a50;
      pcVar2 = (local_2bc0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a60,pcVar2,pcVar2 + local_2bc0->_M_string_length);
      std::__cxx11::string::append((char *)&local_2a60);
      uVar3 = -generateDatasetImages::imagenum;
      if (0 < generateDatasetImages::imagenum) {
        uVar3 = generateDatasetImages::imagenum;
      }
      __len = 1;
      if (9 < uVar3) {
        uVar10 = (ulong)uVar3;
        uVar14 = 4;
        do {
          __len = uVar14;
          uVar4 = (uint)uVar10;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_00107de9;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_00107de9;
          }
          if (uVar4 < 10000) goto LAB_00107de9;
          uVar10 = uVar10 / 10000;
          uVar14 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_00107de9:
      uVar14 = (uint)generateDatasetImages::imagenum >> 0x1f;
      local_2b88[0]._M_dataplus._M_p = (pointer)&local_2b88[0].field_2;
      std::__cxx11::string::_M_construct
                ((ulong)local_2b88,(char)__len - (char)(generateDatasetImages::imagenum >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_2b88[0]._M_dataplus._M_p + uVar14,__len,uVar3);
      pMVar11 = (Mat *)0xf;
      if (local_2a60 != local_2a50) {
        pMVar11 = (Mat *)local_2a50[0];
      }
      if (pMVar11 < (Mat *)(local_2b88[0]._M_string_length + (long)local_2a58)) {
        uVar12 = (Mat *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b88[0]._M_dataplus._M_p != &local_2b88[0].field_2) {
          uVar12 = local_2b88[0].field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < (Mat *)(local_2b88[0]._M_string_length + (long)local_2a58))
        goto LAB_00107e9e;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_2b88,0,(char *)0x0,(ulong)local_2a60);
      }
      else {
LAB_00107e9e:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2a60,(ulong)local_2b88[0]._M_dataplus._M_p);
      }
      local_2c98 = &local_2c88;
      plVar1 = puVar7 + 2;
      if ((long *)*puVar7 == plVar1) {
        local_2c88 = *plVar1;
        uStack_2c80 = puVar7[3];
      }
      else {
        local_2c88 = *plVar1;
        local_2c98 = (long *)*puVar7;
      }
      local_2c90 = puVar7[1];
      *puVar7 = plVar1;
      puVar7[1] = 0;
      *(undefined1 *)plVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b88[0]._M_dataplus._M_p != &local_2b88[0].field_2) {
        operator_delete(local_2b88[0]._M_dataplus._M_p,
                        (ulong)(local_2b88[0].field_2._M_allocated_capacity + 1));
      }
      if (local_2a60 != local_2a50) {
        operator_delete(local_2a60,(ulong)(local_2a50[0] + 1));
      }
      std::ofstream::ofstream((string *)&local_2a60);
      local_2c18[0] = local_2c08;
      pcVar2 = (local_2bc8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c18,pcVar2,pcVar2 + local_2bc8->_M_string_length);
      loadRandomImage(local_2b88);
      if (local_2c18[0] != local_2c08) {
        operator_delete(local_2c18[0],local_2c08[0] + 1);
      }
      local_2b28[0] = local_2b18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b28,local_2c98,(undefined1 *)(local_2c90 + (long)local_2c98));
      std::__cxx11::string::append((char *)local_2b28);
      std::ofstream::open((string *)&local_2a60,(_Ios_Openmode)(Mat *)local_2b28);
      if (local_2b28[0] != local_2b18) {
        operator_delete(local_2b28[0],local_2b18[0] + 1);
      }
      cv::Mat::Mat((Mat *)local_2b28);
      cv::Mat::Mat(local_2ac0);
      uVar3 = std::random_device::_M_getval();
      local_2bb8 = p_Var13 + 1;
      local_2740._M_x[0] = (unsigned_long)uVar3;
      lVar9 = 1;
      uVar10 = local_2740._M_x[0];
      do {
        uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar9);
        local_2740._M_x[lVar9] = uVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x270);
      local_2740._M_p = 0x270;
      dVar15 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_2740);
      local_2c48 = dVar15 * 0.19999999999999996 + 0.8;
      local_2bb0 = (double)*(int *)((long)&p_Var13[1]._M_prev + 4);
      rVar5 = std::uniform_int_distribution<int>::operator()
                        (&local_2c50,&local_2740,&local_2c50._M_param);
      rVar6 = std::uniform_int_distribution<int>::operator()
                        (&local_2c50,&local_2740,&local_2c50._M_param);
      local_2be8 = (double)*(int *)((long)&p_Var13[1]._M_prev + 4);
      uStack_2be0 = 0;
      local_2bf8 = (double)*(int *)&p_Var13[1]._M_prev;
      uStack_2bf0 = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2a60,"1 ",2);
      local_2c48 = (local_2c48 * local_2c60 * dVar16) / local_2bb0;
      local_2be8 = local_2be8 * local_2c48;
      poVar8 = std::ostream::_M_insert<double>((double)((int)local_2be8 / 2 + rVar5) / dVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      local_2bf8 = local_2bf8 * local_2c48;
      poVar8 = std::ostream::_M_insert<double>((double)((int)local_2bf8 / 2 + rVar6) / dVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = std::ostream::_M_insert<double>((double)(int)local_2be8 / dVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = std::ostream::_M_insert<double>((double)(int)local_2bf8 / dVar16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::ofstream::close();
      local_2ca8[0] = 0;
      local_2cb8.x = 0x1010000;
      local_2c78.sz.width = 0;
      local_2c78.sz.height = 0;
      local_2c78.flags = 0x2010000;
      local_2c78.obj = local_2ac0;
      local_2cb0 = local_2b88;
      local_2c58 = image_size;
      local_2c54 = image_size;
      cv::resize(0,0,&local_2cb8,&local_2c78,&local_2c58,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"back",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      local_2ca8[0] = 0;
      local_2cb8.x = 0x1010000;
      local_2cb0 = (string *)local_2bb8;
      local_2c78.sz.width = 0;
      local_2c78.sz.height = 0;
      local_2c78.flags = 0x2010000;
      local_2c78.obj = local_2b28;
      local_2ba8 = CONCAT44((int)(local_2c48 * (double)(int)p_Var13[1]._M_prev),
                            (int)(local_2c48 * (double)(int)((ulong)p_Var13[1]._M_prev >> 0x20)));
      cv::resize(0,0,&local_2cb8,&local_2c78,&local_2ba8,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"front",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      local_2cb8.y = rVar6;
      local_2cb8.x = rVar5;
      overlayImage(local_2ac0,(Mat *)local_2b28,&local_2cb8);
      local_2cb8 = (Point)local_2ca8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2cb8,local_2c98,(undefined1 *)(local_2c90 + (long)local_2c98));
      std::__cxx11::string::append((char *)&local_2cb8);
      local_2c78.sz.width = 0;
      local_2c78.sz.height = 0;
      local_2c78.flags = 0x1010000;
      local_2c78.obj = local_2ac0;
      local_2c28 = 0;
      local_2c38 = (undefined1  [16])0x0;
      cv::imwrite((string *)&local_2cb8,&local_2c78,(vector *)local_2c38);
      if ((void *)local_2c38._0_8_ != (void *)0x0) {
        operator_delete((void *)local_2c38._0_8_,local_2c28 - local_2c38._0_8_);
      }
      if (local_2cb8 != (Point)local_2ca8) {
        operator_delete((void *)local_2cb8,local_2ca8[0] + 1);
      }
      cv::Mat::~Mat(local_2ac0);
      cv::Mat::~Mat((Mat *)local_2b28);
      cv::Mat::~Mat((Mat *)local_2b88);
      local_2a60 = local_2bd0;
      *(undefined8 *)((long)&local_2a60 + (long)local_2bd0[-3]) = local_2bd8;
      std::filebuf::~filebuf((filebuf *)&local_2a58);
      std::ios_base::~ios_base(local_2968);
      if (local_2c98 != &local_2c88) {
        operator_delete(local_2c98,local_2c88 + 1);
      }
      p_Var13 = (((_List_base<cv::Mat,_std::allocator<cv::Mat>_> *)&p_Var13->_M_next)->_M_impl).
                _M_node.super__List_node_base._M_next;
    } while (p_Var13 != (_List_node_base *)&local_2ba0);
  }
  std::__cxx11::_List_base<cv::Mat,_std::allocator<cv::Mat>_>::_M_clear(&local_2ba0);
  cv::Mat::~Mat(local_2800);
  cv::Mat::~Mat((Mat *)local_27a0);
  std::random_device::_M_fini();
  return;
}

Assistant:

void generateDatasetImages(string plate_path, string backgr_path, string output_folder, int image_size, double plate_scale, int nwarps){
    static int imagenum;

    filesystem::create_directory(output_folder);
    
    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(1, image_size-plate_scale*image_size);
    uniform_real_distribution<> realgen(0.8, 1);
    auto plate = cv::imread(plate_path, cv::IMREAD_UNCHANGED);
    cv::Mat blured;
    int ksize = (plate.rows/2)%2==0 ? plate.rows/2+1 : plate.rows/2;
    cv::GaussianBlur(plate, blured, cv::Size(ksize,ksize), cv::BORDER_DEFAULT);
    auto wrps = randomWarps(blured, nwarps);

    for (auto& plt: wrps) {
        imagenum++;
        string name = output_folder+"/" + to_string(imagenum);
        ofstream file;
        auto back = loadRandomImage(backgr_path);
        file.open(name + ".txt");
        cv::Mat resplt,resbg;
        gen.seed(rd());
        auto scale = realgen(gen)*plate_scale*image_size/plt.cols;
        int x = intgen(gen);
        int y =  intgen(gen);
        int width = scale*plt.cols;
        int hight = scale*plt.rows;
        double yolo_x = double(x+width/2)/image_size;
        double yolo_y = double(y+hight/2)/image_size;
        double yolo_w = double(width)/image_size;
        double yolo_h = double(hight)/image_size;
        file <<"1 "<<yolo_x<<" "<<yolo_y<<" "<<yolo_w<<" "<<yolo_h<<endl;
        file.close();
        cv::resize(back, resbg, cv::Size(image_size,image_size));
        cout<<"back"<<endl;
        cv::resize(plt, resplt, cv::Size(scale*plt.cols, scale*plt.rows));
        cout<<"front"<<endl;
        overlayImage(resbg, resplt, cv::Point(x,y));
        cv::imwrite(name + ".png", resbg);
    }
}